

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.h
# Opt level: O0

FreePageEntry * __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::BackgroundPageQueue::PopFreePageEntry(BackgroundPageQueue *this)

{
  FreePageEntry *pFVar1;
  FreePageEntry *head;
  AutoCriticalSection autoCS;
  BackgroundPageQueue *this_local;
  
  autoCS.cs = (CriticalSection *)this;
  AutoCriticalSection::AutoCriticalSection
            ((AutoCriticalSection *)&head,&this->backgroundPageQueueCriticalSection);
  pFVar1 = this->bgFreePageList;
  if (pFVar1 != (FreePageEntry *)0x0) {
    this->bgFreePageList = this->bgFreePageList->Next;
  }
  AutoCriticalSection::~AutoCriticalSection((AutoCriticalSection *)&head);
  return pFVar1;
}

Assistant:

FreePageEntry* PopFreePageEntry()
        {
#if SUPPORT_WIN32_SLIST
            return (FreePageEntry *)::InterlockedPopEntrySList(&bgFreePageList);
#else
            AutoCriticalSection autoCS(&backgroundPageQueueCriticalSection);
            FreePageEntry* head = bgFreePageList;
            if (head)
            {
                bgFreePageList = bgFreePageList->Next;
            }
            return head;
#endif
        }